

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall Instance::computeConstraints(Instance *this)

{
  bool bVar1;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> *in_RDI;
  Edge *edge;
  iterator __end2;
  iterator __begin2;
  vector<Edge_*,_std::allocator<Edge_*>_> *__range2;
  Train *train;
  iterator __end1;
  iterator __begin1;
  vector<Train,_std::allocator<Train>_> *__range1;
  Train *in_stack_00000118;
  Instance *in_stack_00000120;
  Train *in_stack_00000128;
  Instance *in_stack_00000130;
  Train *in_stack_00000138;
  Instance *in_stack_00000140;
  Edge *in_stack_000001c0;
  Train *in_stack_000001c8;
  Instance *in_stack_000001d0;
  vector<Edge_*,_std::allocator<Edge_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_38;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> *local_30;
  reference local_28;
  Train *local_20;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> local_18;
  __normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_> *local_10;
  
  local_10 = in_RDI + 0x24;
  local_18._M_current =
       (Train *)std::vector<Train,_std::allocator<Train>_>::begin
                          ((vector<Train,_std::allocator<Train>_> *)in_stack_ffffffffffffffa8);
  local_20 = (Train *)std::vector<Train,_std::allocator<Train>_>::end
                                ((vector<Train,_std::allocator<Train>_> *)in_stack_ffffffffffffffa8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    local_28 = __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::
               operator*(&local_18);
    computeReachableConstraint(in_stack_00000120,in_stack_00000118);
    computeCollisionConstraint(in_stack_00000130,in_stack_00000128);
    local_30 = in_RDI + 0x21;
    local_38._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(in_stack_ffffffffffffffa8);
    std::vector<Edge_*,_std::allocator<Edge_*>_>::end(in_stack_ffffffffffffffa8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)in_RDI,
                         (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator*(&local_38);
      computeVssConstraint(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_38);
    }
    computeLengthConstraint(in_stack_00000140,in_stack_00000138);
    __gnu_cxx::__normal_iterator<Train_*,_std::vector<Train,_std::allocator<Train>_>_>::operator++
              (&local_18);
  }
  return;
}

Assistant:

void Instance::computeConstraints() {
  // these constraints always have to hold no matter the task
  for (Train &train : trains) {

    computeReachableConstraint(train);

    computeCollisionConstraint(train);
    for (Edge *edge : graph.edges) {
      computeVssConstraint(train, edge);
    }

    computeLengthConstraint(train);
  }
}